

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O3

void Vec_VecPush(Vec_Vec_t *p,int Level,void *Entry)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  void **ppvVar4;
  void *pvVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = p->nSize;
  if (iVar6 <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(p->pArray,(long)iVar1 << 3);
        iVar6 = p->nSize;
      }
      p->pArray = ppvVar4;
      p->nCap = iVar1;
    }
    if (iVar6 <= Level) {
      lVar7 = (long)iVar6;
      iVar6 = (Level - iVar6) + 1;
      do {
        pvVar5 = calloc(1,0x10);
        p->pArray[lVar7] = pvVar5;
        lVar7 = lVar7 + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
    p->nSize = iVar1;
    iVar6 = iVar1;
  }
  if ((-1 < Level) && (Level < iVar6)) {
    puVar3 = (uint *)p->pArray[(uint)Level];
    uVar2 = puVar3[1];
    if (uVar2 == *puVar3) {
      if ((int)uVar2 < 0x10) {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar5 = malloc(0x80);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar3 + 2),0x80);
        }
        *(void **)(puVar3 + 2) = pvVar5;
        *puVar3 = 0x10;
      }
      else {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar5 = malloc((ulong)uVar2 << 4);
        }
        else {
          pvVar5 = realloc(*(void **)(puVar3 + 2),(ulong)uVar2 << 4);
        }
        *(void **)(puVar3 + 2) = pvVar5;
        *puVar3 = uVar2 * 2;
      }
    }
    else {
      pvVar5 = *(void **)(puVar3 + 2);
    }
    uVar2 = puVar3[1];
    puVar3[1] = uVar2 + 1;
    *(void **)((long)pvVar5 + (long)(int)uVar2 * 8) = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

static inline void Vec_VecPush( Vec_Vec_t * p, int Level, void * Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_PtrAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_PtrPush( Vec_VecEntry(p, Level), Entry );
}